

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O0

void __thiscall
fasttext::DenseMatrix::uniformThread(DenseMatrix *this,real a,int block,int32_t seed)

{
  uint uVar1;
  long lVar2;
  float *pfVar3;
  int in_ESI;
  long in_RDI;
  result_type_conflict rVar4;
  int64_t i;
  int64_t blockSize;
  uniform_real_distribution<double> uniform;
  minstd_rand rng;
  linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  undefined8 local_40;
  
  std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (result_type)in_stack_ffffffffffffffa8);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (double)in_stack_ffffffffffffffa8,9.15855910549315e-318);
  lVar2 = (*(long *)(in_RDI + 8) * *(long *)(in_RDI + 0x10)) / 10;
  local_40 = lVar2 * in_ESI;
  while( true ) {
    uVar1 = in_stack_ffffffffffffffb4 & 0xffffff;
    if ((long)local_40 < *(long *)(in_RDI + 8) * *(long *)(in_RDI + 0x10)) {
      uVar1 = CONCAT13((long)local_40 < lVar2 * (in_ESI + 1),(int3)in_stack_ffffffffffffffb4);
    }
    in_stack_ffffffffffffffb4 = uVar1;
    if ((char)(in_stack_ffffffffffffffb4 >> 0x18) == '\0') break;
    rVar4 = std::uniform_real_distribution<double>::operator()
                      ((uniform_real_distribution<double> *)
                       CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffa8);
    in_stack_ffffffffffffffb0 = (float)rVar4;
    pfVar3 = intgemm::AlignedVector<float>::operator[]
                       ((AlignedVector<float> *)(in_RDI + 0x18),local_40);
    *pfVar3 = in_stack_ffffffffffffffb0;
    local_40 = local_40 + 1;
  }
  return;
}

Assistant:

void DenseMatrix::uniformThread(real a, int block, int32_t seed) {
  std::minstd_rand rng(block + seed);
  std::uniform_real_distribution<> uniform(-a, a);
  int64_t blockSize = (m_ * n_) / 10;
  for (int64_t i = blockSize * block;
       i < (m_ * n_) && i < blockSize * (block + 1);
       i++) {
    data_[i] = uniform(rng);
  }
}